

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

ExprP<vkt::shaderexecutor::Void> * vkt::shaderexecutor::voidP(void)

{
  int iVar1;
  Void local_9;
  
  if (voidP()::singleton == '\0') {
    iVar1 = __cxa_guard_acquire(&voidP()::singleton);
    if (iVar1 != 0) {
      Void::Void(&local_9);
      constant<vkt::shaderexecutor::Void>((shaderexecutor *)&voidP::singleton,&local_9);
      __cxa_atexit(ExprP<vkt::shaderexecutor::Void>::~ExprP,&voidP::singleton,&__dso_handle);
      __cxa_guard_release(&voidP()::singleton);
    }
  }
  return &voidP::singleton;
}

Assistant:

const ExprP<Void>& voidP (void)
{
	static const ExprP<Void> singleton = constant(Void());

	return singleton;
}